

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysisbase.h
# Opt level: O3

void __thiscall ICM::Compiler::AnalysisBase::printTable(AnalysisBase *this)

{
  pointer puVar1;
  Node *in_RDX;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *e;
  pointer puVar2;
  string local_48;
  
  puVar1 = (this->Table->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->Table->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  if (puVar2 < puVar1) {
    do {
      ICM::to_string_abi_cxx11_
                (&local_48,
                 (ICM *)(puVar2->_M_t).
                        super___uniq_ptr_impl<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>
                        .super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl,in_RDX);
      printf("%s",local_48._M_dataplus._M_p);
      putchar(10);
      in_RDX = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_00;
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return;
}

Assistant:

void printTable() {
				for (auto &e : rangei(Table.begin() + 1, Table.end()))
					println(ICM::to_string(*e));
			}